

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O2

void __thiscall
wabt::anon_unknown_1::BinaryWriter::BeginCustomSection(BinaryWriter *this,char *name)

{
  Stream *this_00;
  Stream *stream;
  PrintChars in_R9D;
  string_view s;
  char desc [100];
  
  snprintf(desc,100,"section \"%s\"",name);
  WriteSectionHeader(this,desc,Custom);
  this_00 = this->stream_;
  stream = (Stream *)strlen(name);
  s._M_str = "custom section name";
  s._M_len = (size_t)name;
  WriteStr((wabt *)this_00,stream,s,(char *)0x1,in_R9D);
  return;
}

Assistant:

void BinaryWriter::BeginCustomSection(const char* name) {
  char desc[100];
  wabt_snprintf(desc, sizeof(desc), "section \"%s\"", name);
  WriteSectionHeader(desc, BinarySection::Custom);
  WriteStr(stream_, name, "custom section name", PrintChars::Yes);
}